

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O0

int add_addr_to_dev(pcap_if_t *curdev,sockaddr *addr,size_t addr_size,sockaddr *netmask,
                   size_t netmask_size,sockaddr *broadaddr,size_t broadaddr_size,sockaddr *dstaddr,
                   size_t dstaddr_size,char *errbuf)

{
  pcap_addr *ppVar1;
  pcap_addr *__ptr;
  int *piVar2;
  char *pcVar3;
  sockaddr *psVar4;
  pcap_addr_t *nextaddr;
  pcap_addr_t *prevaddr;
  pcap_addr_t *curaddr;
  sockaddr *broadaddr_local;
  size_t netmask_size_local;
  sockaddr *netmask_local;
  size_t addr_size_local;
  sockaddr *addr_local;
  pcap_if_t *curdev_local;
  
  __ptr = (pcap_addr *)malloc(0x28);
  if (__ptr == (pcap_addr *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = pcap_strerror(*piVar2);
    snprintf(errbuf,0x100,"malloc: %s",pcVar3);
    curdev_local._4_4_ = -1;
  }
  else {
    __ptr->next = (pcap_addr *)0x0;
    if (addr == (sockaddr *)0x0) {
      __ptr->addr = (sockaddr *)0x0;
    }
    else {
      psVar4 = dup_sockaddr(addr,addr_size);
      __ptr->addr = psVar4;
      if (__ptr->addr == (sockaddr *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = pcap_strerror(*piVar2);
        snprintf(errbuf,0x100,"malloc: %s",pcVar3);
        free(__ptr);
        return -1;
      }
    }
    if (netmask == (sockaddr *)0x0) {
      __ptr->netmask = (sockaddr *)0x0;
    }
    else {
      psVar4 = dup_sockaddr(netmask,netmask_size);
      __ptr->netmask = psVar4;
      if (__ptr->netmask == (sockaddr *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = pcap_strerror(*piVar2);
        snprintf(errbuf,0x100,"malloc: %s",pcVar3);
        if (__ptr->addr != (sockaddr *)0x0) {
          free(__ptr->addr);
        }
        free(__ptr);
        return -1;
      }
    }
    if (broadaddr == (sockaddr *)0x0) {
      __ptr->broadaddr = (sockaddr *)0x0;
    }
    else {
      psVar4 = dup_sockaddr(broadaddr,broadaddr_size);
      __ptr->broadaddr = psVar4;
      if (__ptr->broadaddr == (sockaddr *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = pcap_strerror(*piVar2);
        snprintf(errbuf,0x100,"malloc: %s",pcVar3);
        if (__ptr->netmask != (sockaddr *)0x0) {
          free(__ptr->netmask);
        }
        if (__ptr->addr != (sockaddr *)0x0) {
          free(__ptr->addr);
        }
        free(__ptr);
        return -1;
      }
    }
    if (dstaddr == (sockaddr *)0x0) {
      __ptr->dstaddr = (sockaddr *)0x0;
    }
    else {
      psVar4 = dup_sockaddr(dstaddr,dstaddr_size);
      __ptr->dstaddr = psVar4;
      if (__ptr->dstaddr == (sockaddr *)0x0) {
        piVar2 = __errno_location();
        pcVar3 = pcap_strerror(*piVar2);
        snprintf(errbuf,0x100,"malloc: %s",pcVar3);
        if (__ptr->broadaddr != (sockaddr *)0x0) {
          free(__ptr->broadaddr);
        }
        if (__ptr->netmask != (sockaddr *)0x0) {
          free(__ptr->netmask);
        }
        if (__ptr->addr != (sockaddr *)0x0) {
          free(__ptr->addr);
        }
        free(__ptr);
        return -1;
      }
    }
    ppVar1 = curdev->addresses;
    do {
      nextaddr = ppVar1;
      if (nextaddr == (pcap_addr_t *)0x0) break;
      ppVar1 = nextaddr->next;
    } while (nextaddr->next != (pcap_addr *)0x0);
    if (nextaddr == (pcap_addr_t *)0x0) {
      curdev->addresses = __ptr;
    }
    else {
      nextaddr->next = __ptr;
    }
    curdev_local._4_4_ = 0;
  }
  return curdev_local._4_4_;
}

Assistant:

int
add_addr_to_dev(pcap_if_t *curdev,
    struct sockaddr *addr, size_t addr_size,
    struct sockaddr *netmask, size_t netmask_size,
    struct sockaddr *broadaddr, size_t broadaddr_size,
    struct sockaddr *dstaddr, size_t dstaddr_size,
    char *errbuf)
{
	pcap_addr_t *curaddr, *prevaddr, *nextaddr;

	curaddr = malloc(sizeof(pcap_addr_t));
	if (curaddr == NULL) {
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "malloc: %s", pcap_strerror(errno));
		return (-1);
	}

	curaddr->next = NULL;
	if (addr != NULL) {
		curaddr->addr = dup_sockaddr(addr, addr_size);
		if (curaddr->addr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->addr = NULL;

	if (netmask != NULL) {
		curaddr->netmask = dup_sockaddr(netmask, netmask_size);
		if (curaddr->netmask == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->netmask = NULL;

	if (broadaddr != NULL) {
		curaddr->broadaddr = dup_sockaddr(broadaddr, broadaddr_size);
		if (curaddr->broadaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->broadaddr = NULL;

	if (dstaddr != NULL) {
		curaddr->dstaddr = dup_sockaddr(dstaddr, dstaddr_size);
		if (curaddr->dstaddr == NULL) {
			(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
			    "malloc: %s", pcap_strerror(errno));
			if (curaddr->broadaddr != NULL)
				free(curaddr->broadaddr);
			if (curaddr->netmask != NULL)
				free(curaddr->netmask);
			if (curaddr->addr != NULL)
				free(curaddr->addr);
			free(curaddr);
			return (-1);
		}
	} else
		curaddr->dstaddr = NULL;

	/*
	 * Find the end of the list of addresses.
	 */
	for (prevaddr = curdev->addresses; prevaddr != NULL; prevaddr = nextaddr) {
		nextaddr = prevaddr->next;
		if (nextaddr == NULL) {
			/*
			 * This is the end of the list.
			 */
			break;
		}
	}

	if (prevaddr == NULL) {
		/*
		 * The list was empty; this is the first member.
		 */
		curdev->addresses = curaddr;
	} else {
		/*
		 * "prevaddr" is the last member of the list; append
		 * this member to it.
		 */
		prevaddr->next = curaddr;
	}

	return (0);
}